

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzip_file_system.cpp
# Opt level: O1

void __thiscall
duckdb::MiniZStreamWrapper::Write
          (MiniZStreamWrapper *this,CompressedFile *file,StreamData *sd,data_ptr_t uncompressed_data
          ,int64_t uncompressed_size)

{
  uchar *puVar1;
  uint uVar2;
  int iVar3;
  mz_ulong mVar4;
  pointer pmVar5;
  pointer pFVar6;
  InternalException *this_00;
  unsigned_long val;
  unique_ptr<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>,_true>
  *this_01;
  string local_50;
  
  mVar4 = duckdb_miniz::mz_crc32(this->crc,uncompressed_data,uncompressed_size);
  this->crc = mVar4;
  this->total_size = this->total_size + uncompressed_size;
  if (0 < uncompressed_size) {
    this_01 = &this->mz_stream_ptr;
    do {
      val = (long)(sd->out_buff).
                  super_unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>._M_t.
                  super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl +
            (sd->out_buf_size - (long)sd->out_buff_start);
      pmVar5 = unique_ptr<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>,_true>
               ::operator->(this_01);
      pmVar5->next_in = uncompressed_data;
      uVar2 = NumericCastImpl<unsigned_int,_long,_false>::Convert(uncompressed_size);
      pmVar5 = unique_ptr<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>,_true>
               ::operator->(this_01);
      pmVar5->avail_in = uVar2;
      puVar1 = sd->out_buff_start;
      pmVar5 = unique_ptr<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>,_true>
               ::operator->(this_01);
      pmVar5->next_out = puVar1;
      uVar2 = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert(val);
      pmVar5 = unique_ptr<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>,_true>
               ::operator->(this_01);
      pmVar5->avail_out = uVar2;
      iVar3 = duckdb_miniz::mz_deflate
                        ((this_01->
                         super_unique_ptr<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>_>
                         )._M_t.
                         super___uniq_ptr_impl<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_duckdb_miniz::mz_stream_s_*,_std::default_delete<duckdb_miniz::mz_stream_s>_>
                         .super__Head_base<0UL,_duckdb_miniz::mz_stream_s_*,_false>._M_head_impl,0);
      if (iVar3 != 0) {
        this_00 = (InternalException *)__cxa_allocate_exception(0x10);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,"Failed to compress GZIP block","");
        InternalException::InternalException(this_00,&local_50);
        __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pmVar5 = unique_ptr<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>,_true>
               ::operator->(this_01);
      sd->out_buff_start = sd->out_buff_start + (val - pmVar5->avail_out);
      pmVar5 = unique_ptr<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>,_true>
               ::operator->(this_01);
      if (pmVar5->avail_out == 0) {
        pFVar6 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::
                 operator->(&file->child_handle);
        (*pFVar6->file_system->_vptr_FileSystem[6])();
        sd->out_buff_start =
             (sd->out_buff).super_unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>
             ._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
             super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
      }
      pmVar5 = unique_ptr<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>,_true>
               ::operator->(this_01);
      uncompressed_data = uncompressed_data + (uncompressed_size - (ulong)pmVar5->avail_in);
      pmVar5 = unique_ptr<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>,_true>
               ::operator->(this_01);
      uncompressed_size = (int64_t)pmVar5->avail_in;
    } while (uncompressed_size != 0);
  }
  return;
}

Assistant:

void MiniZStreamWrapper::Write(CompressedFile &file, StreamData &sd, data_ptr_t uncompressed_data,
                               int64_t uncompressed_size) {
	// update the src and the total size
	crc = duckdb_miniz::mz_crc32(crc, reinterpret_cast<const unsigned char *>(uncompressed_data),
	                             UnsafeNumericCast<size_t>(uncompressed_size));
	total_size += UnsafeNumericCast<idx_t>(uncompressed_size);

	auto remaining = uncompressed_size;
	while (remaining > 0) {
		auto output_remaining = UnsafeNumericCast<idx_t>((sd.out_buff.get() + sd.out_buf_size) - sd.out_buff_start);

		mz_stream_ptr->next_in = reinterpret_cast<const unsigned char *>(uncompressed_data);
		mz_stream_ptr->avail_in = NumericCast<unsigned int>(remaining);
		mz_stream_ptr->next_out = sd.out_buff_start;
		mz_stream_ptr->avail_out = NumericCast<unsigned int>(output_remaining);

		auto res = mz_deflate(mz_stream_ptr.get(), duckdb_miniz::MZ_NO_FLUSH);
		if (res != duckdb_miniz::MZ_OK) {
			D_ASSERT(res != duckdb_miniz::MZ_STREAM_END);
			throw InternalException("Failed to compress GZIP block");
		}
		sd.out_buff_start += output_remaining - mz_stream_ptr->avail_out;
		if (mz_stream_ptr->avail_out == 0) {
			// no more output buffer available: flush
			file.child_handle->Write(sd.out_buff.get(),
			                         UnsafeNumericCast<idx_t>(sd.out_buff_start - sd.out_buff.get()));
			sd.out_buff_start = sd.out_buff.get();
		}
		auto written = UnsafeNumericCast<idx_t>(remaining - mz_stream_ptr->avail_in);
		uncompressed_data += written;
		remaining = mz_stream_ptr->avail_in;
	}
}